

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book_perf_test.cc
# Opt level: O0

type test_cancel(order_book *ob,unsigned_long count)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__rhs;
  type tVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  time_point end;
  unsigned_long i;
  time_point start;
  uint64_t in_stack_00000080;
  uint64_t in_stack_00000088;
  order_book *in_stack_00000090;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  
  std::chrono::_V2::system_clock::now();
  for (__lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)0x0; __lhs < in_RSI;
      __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               *)((long)&(__lhs->__d).__r + 1)) {
    helix::order_book::cancel(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  __rhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::operator-(__lhs,__rhs);
  return (type)tVar1.__r;
}

Assistant:

auto test_cancel(order_book& ob, unsigned long count)
{
    auto start = clock_type::now();
    for (unsigned long i = 0; i < count; i++) {
        ob.cancel(i, quantity/2);
    }
    auto end = clock_type::now();
    return end - start;
}